

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O0

int delete_watch(filter *filt,knote *kn)

{
  int __fd;
  int iVar1;
  long in_RSI;
  long in_RDI;
  int ifd;
  undefined4 local_4;
  
  __fd = *(int *)(in_RSI + 0x90);
  if (__fd < 0) {
    local_4 = 0;
  }
  else {
    iVar1 = epoll_ctl(*(int *)(*(long *)(in_RDI + 0x98) + 0x7c0),2,__fd,(epoll_event *)0x0);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      close(__fd);
      *(undefined4 *)(in_RSI + 0x90) = 0xffffffff;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
delete_watch(struct filter *filt, struct knote *kn)
{
    int ifd = kn->kn_vnode.inotifyfd;

    if (ifd < 0)
        return (0);
    if (epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_DEL, ifd, NULL) < 0) {
        dbg_perror("epoll_ctl(2)");
        return (-1);
    }
    (void) close(ifd);
    kn->kn_vnode.inotifyfd = -1;

    return (0);
}